

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O0

Variant * Jinx::Impl::CallWith(Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  bool bVar1;
  const_reference pvVar2;
  element_type *peVar3;
  element_type *this;
  RuntimeID id;
  vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> local_a8;
  reference local_90;
  pair<const_Jinx::Variant,_Jinx::Variant> *pair;
  iterator __end3;
  iterator __begin3;
  element_type *__range3;
  element_type *coll;
  CollectionPtr collPtr;
  Parameters fnParams;
  undefined1 local_30 [8];
  ScriptIPtr s;
  Parameters *params_local;
  ScriptPtr *script_local;
  
  s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)params;
  std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>((shared_ptr<Jinx::IScript> *)local_30);
  bVar1 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::empty
                    ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                     s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    Script::Error(peVar3,"\'call with\' function invoked with no parameters");
    Variant::Variant(__return_storage_ptr__,(nullptr_t)0x0);
  }
  else {
    pvVar2 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                       ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                        s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,0);
    bVar1 = Variant::IsFunction(pvVar2);
    if (bVar1) {
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::vector
                ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                 &collPtr.
                  super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      pvVar2 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                         ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                          s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,1);
      bVar1 = Variant::IsCollection(pvVar2);
      if (bVar1) {
        std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                  ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                   s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi,1);
        Variant::GetCollection((Variant *)&coll);
        this = std::
               __shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&coll);
        __end3 = std::
                 map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
                 ::begin(this);
        pair = (pair<const_Jinx::Variant,_Jinx::Variant> *)
               std::
               map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>
               ::end(this);
        while( true ) {
          bVar1 = std::operator!=(&__end3,(_Self *)&pair);
          if (!bVar1) break;
          local_90 = std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::
                     operator*(&__end3);
          std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back
                    ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                     &collPtr.
                      super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,&local_90->second);
          std::_Rb_tree_iterator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>::operator++
                    (&__end3);
        }
        std::
        shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
        ::~shared_ptr((shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>_>
                       *)&coll);
      }
      else {
        pvVar2 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                           ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                            s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi,1);
        std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::push_back
                  ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                   &collPtr.
                    super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,pvVar2);
      }
      peVar3 = std::
               __shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      pvVar2 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                         ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                          s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,0);
      id = Variant::GetFunction(pvVar2);
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::vector
                (&local_a8,
                 (vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                 &collPtr.
                  super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      Script::CallFunction(__return_storage_ptr__,peVar3,id,&local_a8);
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::~vector(&local_a8);
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::~vector
                ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                 &collPtr.
                  super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      Script::Error(peVar3,"Invalid parameters to \'call with\' function");
      Variant::Variant(__return_storage_ptr__,(nullptr_t)0x0);
    }
  }
  std::shared_ptr<Jinx::Impl::Script>::~shared_ptr((shared_ptr<Jinx::Impl::Script> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant CallWith(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (params.empty())
		{
			s->Error("'call with' function invoked with no parameters");
			return nullptr;
		}
		if (!params[0].IsFunction())
		{
			s->Error("Invalid parameters to 'call with' function");
			return nullptr;
		}
		Parameters fnParams;
		if (params[1].IsCollection())
		{
			auto collPtr = params[1].GetCollection();
			auto & coll = *collPtr;
			for (const auto & pair : coll)
				fnParams.push_back(pair.second);
		}
		else
		{
			fnParams.push_back(params[1]);
		}
		return s->CallFunction(params[0].GetFunction(), fnParams);
	}